

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

int SSL_CTX_set_tmp_ecdh(SSL_CTX *ctx,EC_KEY *ec_key)

{
  bool bVar1;
  EC_GROUP *pEVar2;
  Span<const_int> nids;
  int nid;
  int local_14;
  
  if ((ec_key != (EC_KEY *)0x0) &&
     (pEVar2 = EC_KEY_get0_group((EC_KEY *)ec_key), pEVar2 != (EC_GROUP *)0x0)) {
    pEVar2 = EC_KEY_get0_group((EC_KEY *)ec_key);
    EC_GROUP_get_curve_name(pEVar2);
    nids.size_ = 1;
    nids.data_ = &local_14;
    bVar1 = ssl_nids_to_group_ids(&ctx->supported_group_list,nids);
    return (uint)bVar1;
  }
  ERR_put_error(0x10,0,0x43,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                ,0xc1e);
  return 0;
}

Assistant:

int SSL_CTX_set_tmp_ecdh(SSL_CTX *ctx, const EC_KEY *ec_key) {
  if (ec_key == NULL || EC_KEY_get0_group(ec_key) == NULL) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_PASSED_NULL_PARAMETER);
    return 0;
  }
  int nid = EC_GROUP_get_curve_name(EC_KEY_get0_group(ec_key));
  return SSL_CTX_set1_groups(ctx, &nid, 1);
}